

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_write_binary(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  byte bVar1;
  size_t __n;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar3 = X->n;
  uVar4 = sVar3 * 8;
  __n = buflen + sVar3 * -8;
  if (buflen < uVar4 || __n == 0) {
    if (buflen < uVar4) {
      lVar2 = buflen * 8;
      sVar3 = buflen;
      do {
        if ((char)(*(ulong *)((long)X->p + (sVar3 & 0xfffffffffffffff8)) >> ((byte)lVar2 & 0x38)) !=
            '\0') {
          return -8;
        }
        sVar3 = sVar3 + 1;
        lVar2 = lVar2 + 8;
      } while (uVar4 != sVar3);
    }
  }
  else {
    memset(buf,0,__n);
    buf = buf + sVar3 * -8 + buflen;
    buflen = uVar4;
  }
  if (buflen != 0) {
    bVar1 = 0;
    uVar4 = 0;
    do {
      buf[buflen - 1] =
           (uchar)(*(ulong *)((long)X->p + (uVar4 & 0xfffffffffffffff8)) >> (bVar1 & 0x38));
      uVar4 = uVar4 + 1;
      bVar1 = bVar1 + 8;
      buflen = buflen - 1;
    } while (buflen != 0);
  }
  return 0;
}

Assistant:

int mbedtls_mpi_write_binary( const mbedtls_mpi *X,
                              unsigned char *buf, size_t buflen )
{
    size_t stored_bytes;
    size_t bytes_to_copy;
    unsigned char *p;
    size_t i;

    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( buflen == 0 || buf != NULL );

    stored_bytes = X->n * ciL;

    if( stored_bytes < buflen )
    {
        /* There is enough space in the output buffer. Write initial
         * null bytes and record the position at which to start
         * writing the significant bytes. In this case, the execution
         * trace of this function does not depend on the value of the
         * number. */
        bytes_to_copy = stored_bytes;
        p = buf + buflen - stored_bytes;
        memset( buf, 0, buflen - stored_bytes );
    }
    else
    {
        /* The output buffer is smaller than the allocated size of X.
         * However X may fit if its leading bytes are zero. */
        bytes_to_copy = buflen;
        p = buf;
        for( i = bytes_to_copy; i < stored_bytes; i++ )
        {
            if( GET_BYTE( X, i ) != 0 )
                return( MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL );
        }
    }

    for( i = 0; i < bytes_to_copy; i++ )
        p[bytes_to_copy - i - 1] = GET_BYTE( X, i );

    return( 0 );
}